

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::DiskSourceTree::MapPath
          (DiskSourceTree *this,string_view virtual_path,string_view disk_path)

{
  compiler *pcVar1;
  string_view path;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  Mapping local_58;
  
  local_68._M_str = virtual_path._M_str;
  local_68._M_len = virtual_path._M_len;
  pcVar1 = (compiler *)disk_path._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_88,&local_68,&local_a9);
  path._M_str = (char *)pcVar1;
  path._M_len = (size_t)disk_path._M_str;
  CanonicalizePath_abi_cxx11_(&local_a8,(compiler *)disk_path._M_len,path);
  Mapping::Mapping(&local_58,&local_88,&local_a8);
  std::
  vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
  ::emplace_back<google::protobuf::compiler::DiskSourceTree::Mapping>(&this->mappings_,&local_58);
  Mapping::~Mapping(&local_58);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void DiskSourceTree::MapPath(absl::string_view virtual_path,
                             absl::string_view disk_path) {
  mappings_.push_back(
      Mapping(std::string(virtual_path), CanonicalizePath(disk_path)));
}